

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_float64_suite::fail_array8_float64_overflow(void)

{
  array<double,_1UL> value;
  value_type input [18];
  decoder decoder;
  undefined4 local_5c;
  size_type local_58;
  return_type local_50;
  uchar local_48 [24];
  decoder local_30;
  
  local_30.input._M_str = local_48;
  local_48[0] = 0xaf;
  local_48[1] = '\x10';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = 0xf0;
  local_48[9] = '?';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = 0xf0;
  local_48[0x11] = '?';
  local_30.input._M_len = 0x12;
  local_30.current.view._M_len = 0;
  local_30.current.view._M_str = (uchar *)0x0;
  local_30.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_30);
  local_50 = 0.0;
  local_58 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float64>::decode(&local_30,&local_50,1);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf5a,"void compact_float64_suite::fail_array8_float64_overflow()",&local_58,&local_5c
            );
  return;
}

Assistant:

void fail_array8_float64_overflow()
{
    const value_type input[] = { token::code::array8_float64, 0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
    format::detail::decoder decoder(input);
    std::array<token::float64::type, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}